

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall wasm::PrintSExpression::visitDataSegment(PrintSExpression *this,DataSegment *curr)

{
  Module *pMVar1;
  pointer puVar2;
  Expression *curr_00;
  pointer pcVar3;
  char *__s;
  ostream *poVar4;
  size_t sVar5;
  ostream *in_RCX;
  Name name;
  Name name_00;
  string_view str;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  poVar4 = this->o;
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)this->indent);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_50,local_48);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  local_50._0_1_ = 0x28;
  std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
  poVar4 = this->o;
  Colors::outputColorCode(poVar4,"\x1b[31m");
  Colors::outputColorCode(poVar4,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"data ",5);
  Colors::outputColorCode(poVar4,"\x1b[0m");
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(curr->super_Named).name.super_IString.str._M_str;
  anon_unknown_217::printName
            ((anon_unknown_217 *)(curr->super_Named).name.super_IString.str._M_len,name,in_RCX);
  local_50 = (long *)CONCAT71(local_50._1_7_,0x20);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
  if (curr->isPassive != false) goto LAB_00840881;
  pMVar1 = this->currModule;
  if (pMVar1 == (Module *)0x0) {
LAB_00840818:
    poVar4 = this->o;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(memory $",9);
    name_00.super_IString.str._M_str = (char *)in_RCX;
    name_00.super_IString.str._M_len = (size_t)(curr->memory).super_IString.str._M_str;
    poVar4 = wasm::operator<<((wasm *)poVar4,(ostream *)(curr->memory).super_IString.str._M_len,
                              name_00);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
  }
  else {
    puVar2 = (pMVar1->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pMVar1->memories).
        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == puVar2) {
      __assert_fail("!currModule || currModule->memories.size() > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                    ,0xd15,"void wasm::PrintSExpression::visitDataSegment(DataSegment *)");
    }
    in_RCX = (ostream *)(curr->memory).super_IString.str._M_str;
    if (in_RCX != *(ostream **)
                   ((long)&(((puVar2->_M_t).
                             super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                             .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->
                           super_Importable).super_Named + 8)) goto LAB_00840818;
  }
  curr_00 = curr->offset;
  printDebugLocation(this,curr_00);
  Visitor<wasm::PrintSExpression,_void>::visit
            ((Visitor<wasm::PrintSExpression,_void> *)this,curr_00);
  local_50 = (long *)CONCAT71(local_50._1_7_,0x20);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
LAB_00840881:
  pcVar3 = (curr->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  str._M_str = (char *)in_RCX;
  str._M_len = (size_t)pcVar3;
  anon_unknown_217::printEscapedString
            ((anon_unknown_217 *)this->o,
             (ostream *)
             ((curr->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish + -(long)pcVar3),str);
  local_50 = (long *)CONCAT71(local_50._1_7_,0x29);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
  __s = this->maybeNewLine;
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
  }
  else {
    sVar5 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar5);
  }
  return;
}

Assistant:

void visitDataSegment(DataSegment* curr) {
    doIndent(o, indent);
    o << '(';
    printMajor(o, "data ");
    printName(curr->name, o);
    o << ' ';
    if (!curr->isPassive) {
      assert(!currModule || currModule->memories.size() > 0);
      if (!currModule || curr->memory != currModule->memories[0]->name) {
        o << "(memory $" << curr->memory << ") ";
      }
      visit(curr->offset);
      o << ' ';
    }
    printEscapedString(o, {curr->data.data(), curr->data.size()});
    o << ')' << maybeNewLine;
  }